

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceFinder.cpp
# Opt level: O1

void __thiscall OpenMD::DistanceFinder::DistanceFinder(DistanceFinder *this,SimInfo *info)

{
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  iterator iVar1;
  Molecule *pMVar2;
  pointer ppAVar3;
  pointer ppRVar4;
  pointer ppBVar5;
  pointer ppBVar6;
  pointer ppTVar7;
  pointer ppIVar8;
  Atom *pAVar9;
  RigidBody *pRVar10;
  Bond *pBVar11;
  Bend *pBVar12;
  Torsion *pTVar13;
  Inversion *pIVar14;
  MoleculeIterator mi;
  MoleculeIterator local_48;
  SimInfo *local_40;
  vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_> *local_38;
  
  this->info_ = info;
  this_00 = &this->stuntdoubles_;
  local_38 = &this->molecules_;
  this_01 = &this->nObjects_;
  local_40 = info;
  memset(this_00,0,0xa8);
  local_48._M_node._0_4_ = local_40->nGlobalRigidBodies_ + local_40->nGlobalAtoms_;
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_01,iVar1,(int *)&local_48);
  }
  else {
    *iVar1._M_current = (int)local_48._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  local_48._M_node._0_4_ = this->info_->nGlobalBonds_;
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_01,iVar1,(int *)&local_48);
  }
  else {
    *iVar1._M_current = (int)local_48._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  local_48._M_node._0_4_ = this->info_->nGlobalBends_;
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_01,iVar1,(int *)&local_48);
  }
  else {
    *iVar1._M_current = (int)local_48._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  local_48._M_node._0_4_ = this->info_->nGlobalTorsions_;
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_01,iVar1,(int *)&local_48);
  }
  else {
    *iVar1._M_current = (int)local_48._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  local_48._M_node._0_4_ = this->info_->nGlobalInversions_;
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_01,iVar1,(int *)&local_48);
  }
  else {
    *iVar1._M_current = (int)local_48._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  local_48._M_node._0_4_ = this->info_->nGlobalMols_;
  iVar1._M_current =
       (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(this_01,iVar1,(int *)&local_48);
  }
  else {
    *iVar1._M_current = (int)local_48._M_node;
    (this->nObjects_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::resize
            (this_00,(long)*(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start);
  std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::resize
            (&this->bonds_,
             (long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[1]);
  std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::resize
            (&this->bends_,
             (long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[2]);
  std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::resize
            (&this->torsions_,
             (long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[3]);
  std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::resize
            (&this->inversions_,
             (long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[4]);
  std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::resize
            (local_38,(long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[5]);
  local_48._M_node = (_Base_ptr)0x0;
  pMVar2 = SimInfo::beginMolecule(this->info_,&local_48);
  while (pMVar2 != (Molecule *)0x0) {
    (local_38->super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>)._M_impl.
    super__Vector_impl_data._M_start[pMVar2->globalIndex_] = pMVar2;
    ppAVar3 = (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppAVar3 ==
        (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pAVar9 = (Atom *)0x0;
    }
    else {
      pAVar9 = *ppAVar3;
    }
    while (pAVar9 != (Atom *)0x0) {
      ppAVar3 = ppAVar3 + 1;
      (this_00->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>).
      _M_impl.super__Vector_impl_data._M_start[(pAVar9->super_StuntDouble).globalIndex_] =
           &pAVar9->super_StuntDouble;
      if (ppAVar3 ==
          (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pAVar9 = (Atom *)0x0;
      }
      else {
        pAVar9 = *ppAVar3;
      }
    }
    ppRVar4 = (pMVar2->rigidBodies_).
              super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppRVar4 ==
        (pMVar2->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pRVar10 = (RigidBody *)0x0;
    }
    else {
      pRVar10 = *ppRVar4;
    }
    while (pRVar10 != (RigidBody *)0x0) {
      ppRVar4 = ppRVar4 + 1;
      (this_00->super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>).
      _M_impl.super__Vector_impl_data._M_start[(pRVar10->super_StuntDouble).globalIndex_] =
           &pRVar10->super_StuntDouble;
      if (ppRVar4 ==
          (pMVar2->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pRVar10 = (RigidBody *)0x0;
      }
      else {
        pRVar10 = *ppRVar4;
      }
    }
    ppBVar5 = (pMVar2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar5 ==
        (pMVar2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pBVar11 = (Bond *)0x0;
    }
    else {
      pBVar11 = *ppBVar5;
    }
    while (pBVar11 != (Bond *)0x0) {
      ppBVar5 = ppBVar5 + 1;
      (this->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_start[(pBVar11->super_ShortRangeInteraction).globalIndex_] =
           pBVar11;
      if (ppBVar5 ==
          (pMVar2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pBVar11 = (Bond *)0x0;
      }
      else {
        pBVar11 = *ppBVar5;
      }
    }
    ppBVar6 = (pMVar2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppBVar6 ==
        (pMVar2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      pBVar12 = (Bend *)0x0;
    }
    else {
      pBVar12 = *ppBVar6;
    }
    while (pBVar12 != (Bend *)0x0) {
      ppBVar6 = ppBVar6 + 1;
      (this->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
      super__Vector_impl_data._M_start[(pBVar12->super_ShortRangeInteraction).globalIndex_] =
           pBVar12;
      if (ppBVar6 ==
          (pMVar2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pBVar12 = (Bend *)0x0;
      }
      else {
        pBVar12 = *ppBVar6;
      }
    }
    ppTVar7 = (pMVar2->torsions_).
              super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppTVar7 ==
        (pMVar2->torsions_).
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pTVar13 = (Torsion *)0x0;
    }
    else {
      pTVar13 = *ppTVar7;
    }
    while (pTVar13 != (Torsion *)0x0) {
      ppTVar7 = ppTVar7 + 1;
      (this->torsions_).super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>.
      _M_impl.super__Vector_impl_data._M_start[(pTVar13->super_ShortRangeInteraction).globalIndex_]
           = pTVar13;
      if (ppTVar7 ==
          (pMVar2->torsions_).
          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pTVar13 = (Torsion *)0x0;
      }
      else {
        pTVar13 = *ppTVar7;
      }
    }
    ppIVar8 = (pMVar2->inversions_).
              super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppIVar8 ==
        (pMVar2->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pIVar14 = (Inversion *)0x0;
    }
    else {
      pIVar14 = *ppIVar8;
    }
    while (pIVar14 != (Inversion *)0x0) {
      ppIVar8 = ppIVar8 + 1;
      (this->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_start[(pIVar14->super_ShortRangeInteraction).globalIndex_] =
           pIVar14;
      if (ppIVar8 ==
          (pMVar2->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar14 = (Inversion *)0x0;
      }
      else {
        pIVar14 = *ppIVar8;
      }
    }
    pMVar2 = SimInfo::nextMolecule(this->info_,&local_48);
  }
  return;
}

Assistant:

DistanceFinder::DistanceFinder(SimInfo* info) : info_(info) {
    nObjects_.push_back(info_->getNGlobalAtoms() +
                        info_->getNGlobalRigidBodies());
    nObjects_.push_back(info_->getNGlobalBonds());
    nObjects_.push_back(info_->getNGlobalBends());
    nObjects_.push_back(info_->getNGlobalTorsions());
    nObjects_.push_back(info_->getNGlobalInversions());
    nObjects_.push_back(info_->getNGlobalMolecules());

    stuntdoubles_.resize(nObjects_[STUNTDOUBLE]);
    bonds_.resize(nObjects_[BOND]);
    bends_.resize(nObjects_[BEND]);
    torsions_.resize(nObjects_[TORSION]);
    inversions_.resize(nObjects_[INVERSION]);
    molecules_.resize(nObjects_[MOLECULE]);

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      molecules_[mol->getGlobalIndex()] = mol;

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        stuntdoubles_[atom->getGlobalIndex()] = atom;
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        stuntdoubles_[rb->getGlobalIndex()] = rb;
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bonds_[bond->getGlobalIndex()] = bond;
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bends_[bend->getGlobalIndex()] = bend;
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsions_[torsion->getGlobalIndex()] = torsion;
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversions_[inversion->getGlobalIndex()] = inversion;
      }
    }
  }